

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_Script_hex_exception_Test::~Script_Script_hex_exception_Test
          (Script_Script_hex_exception_Test *this)

{
  Script_Script_hex_exception_Test *this_local;
  
  ~Script_Script_hex_exception_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, Script_hex_exception) {
  try {
    std::string hex("xxxx");
    Script script(hex);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "hex to byte convert error.");
    return;
  }
  ASSERT_TRUE(false);
}